

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  long *plVar1;
  undefined8 *puVar2;
  U32 UVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  U32 UVar14;
  uint uVar15;
  int *mEnd;
  uint uVar16;
  BYTE *pBVar17;
  long lVar18;
  int *piVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  ulong uVar22;
  seqStore_t *psVar23;
  int iVar24;
  ZSTD_matchState_t *ms_00;
  int *piVar25;
  size_t ofbCandidate;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_cc;
  int *local_c8;
  uint local_bc;
  ulong local_b8;
  BYTE *local_b0;
  uint local_a4;
  int *local_a0;
  BYTE *local_98;
  U32 maxDistance;
  undefined4 uStack_8c;
  int *local_88;
  ZSTD_matchState_t *local_80;
  BYTE *local_78;
  int *local_70;
  int *local_68;
  int local_5c;
  int *local_58;
  seqStore_t *local_50;
  size_t local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_b0 = (ms->window).base;
  local_98 = (ms->window).dictBase;
  local_b8 = (ulong)(ms->window).dictLimit;
  local_68 = (int *)(local_98 + local_b8);
  local_40 = local_98 + (ms->window).lowLimit;
  local_a0 = (int *)CONCAT44(local_a0._4_4_,(ms->cParams).windowLog);
  local_bc = (ms->cParams).minMatch;
  if (5 < local_bc) {
    local_bc = 6;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  local_a4 = (ms->cParams).searchLog;
  local_d8 = 6;
  if (local_a4 < 6) {
    local_d8 = local_a4;
  }
  if (local_d8 < 5) {
    local_d8 = 4;
  }
  local_d4 = *rep;
  local_d0 = rep[1];
  ms->lazySkipping = 0;
  local_78 = local_b0 + local_b8;
  piVar25 = (int *)((ulong)(local_78 == (BYTE *)src) + (long)src);
  local_70 = (int *)((long)src + (srcSize - 0x10));
  piVar19 = (int *)(ulong)ms->nextToUpdate;
  uVar16 = ((int)local_70 - (int)(local_b0 + (long)piVar19)) + 1;
  if (7 < uVar16) {
    uVar16 = 8;
  }
  uVar9 = 0;
  if (local_b0 + (long)piVar19 <= local_70) {
    uVar9 = uVar16;
  }
  iEnd = (int *)(srcSize + (long)src);
  local_c8 = (int *)(ulong)(uVar9 + ms->nextToUpdate);
  UVar3 = ms->rowHashLog;
  _maxDistance = (ulong)(0x38 - UVar3);
  local_cc = 0x18 - UVar3;
  local_48 = 1L << ((byte)local_d8 & 0x3f);
  pUVar4 = ms->hashTable;
  pBVar20 = ms->tagTable;
  local_88 = (int *)src;
  local_80 = ms;
  local_50 = seqStore;
  local_38 = rep;
  for (; piVar19 < local_c8; piVar19 = (int *)((long)piVar19 + 1)) {
    if (0x20 < UVar3 + 8) {
LAB_00159bda:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_b0 + (long)piVar19);
    uVar22 = local_80->hashSalt;
    if (local_bc == 5) {
      sVar10 = (*plVar1 * -0x30e4432345000000 ^ uVar22) >> ((byte)_maxDistance & 0x3f);
    }
    else if (local_bc == 6) {
      sVar10 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar22);
    }
    else {
      sVar10 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar22) >> ((byte)local_cc & 0x1f));
    }
    uVar16 = ((uint)(sVar10 >> 8) & 0xffffff) << ((byte)local_d8 & 0x1f);
    if (((ulong)(pUVar4 + uVar16) & 0x3f) != 0) {
LAB_00159bf9:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar8 = ZSTD_isAligned(pBVar20 + uVar16,local_48);
    if (iVar8 == 0) {
LAB_00159c18:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    local_80->hashCache[(uint)piVar19 & 7] = (U32)sVar10;
  }
  _maxDistance = CONCAT44(uStack_8c,1 << ((byte)local_a0 & 0x1f));
  local_cc = (int)local_b8 + -1;
  local_58 = iEnd + -8;
  uVar9 = local_d4;
  uVar16 = local_d0;
  piVar19 = local_88;
  pBVar20 = local_98;
  ms_00 = local_80;
LAB_001590bf:
  do {
    local_88 = piVar19;
    local_d0 = uVar16;
    local_d4 = uVar9;
    if (local_70 <= piVar25) {
      *local_38 = local_d4;
      local_38[1] = local_d0;
      return (long)iEnd - (long)local_88;
    }
    iVar24 = (int)piVar25 - (int)local_b0;
    iVar8 = iVar24 + 1;
    UVar3 = (ms_00->window).lowLimit;
    UVar14 = iVar8 - maxDistance;
    if (iVar8 - UVar3 <= maxDistance) {
      UVar14 = UVar3;
    }
    if (ms_00->loadedDictEnd != 0) {
      UVar14 = UVar3;
    }
    uVar16 = iVar8 - local_d4;
    pBVar13 = pBVar20;
    if ((uint)local_b8 <= uVar16) {
      pBVar13 = local_b0;
    }
    local_c8 = (int *)((long)piVar25 + 1);
    if (local_cc - uVar16 < 3) {
LAB_00159167:
      uVar22 = 0;
    }
    else {
      uVar22 = 0;
      if (local_d4 <= (iVar24 - UVar14) + 1) {
        if (*local_c8 != *(int *)(pBVar13 + uVar16)) goto LAB_00159167;
        piVar19 = local_68;
        if ((uint)local_b8 <= uVar16) {
          piVar19 = iEnd;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar25 + 5),(BYTE *)((long)(pBVar13 + uVar16) + 4),
                            (BYTE *)iEnd,(BYTE *)piVar19,local_78);
        uVar22 = sVar10 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (local_bc == 6) {
      if (local_d8 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_6_6(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else if (local_d8 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_6_5(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_extDict_6_4(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
    }
    else if (local_bc == 5) {
      if (local_d8 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_5_6(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else if (local_d8 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_extDict_5_5(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_extDict_5_4(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
    }
    else if (local_d8 == 6) {
      uVar11 = ZSTD_RowFindBestMatch_extDict_4_6(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (local_d8 == 5) {
      uVar11 = ZSTD_RowFindBestMatch_extDict_4_5(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar11 = ZSTD_RowFindBestMatch_extDict_4_4(ms_00,(BYTE *)piVar25,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar12 = uVar22;
    if (uVar22 < uVar11) {
      uVar12 = uVar11;
    }
    if (3 < uVar12) {
      sVar10 = 1;
      piVar19 = local_c8;
      if (uVar22 < uVar11) {
        sVar10 = ofbCandidate;
        piVar19 = piVar25;
      }
LAB_001592b1:
      do {
        local_c8 = piVar19;
        uVar22 = sVar10;
        uVar11 = uVar12;
        pBVar20 = local_98;
        if (local_70 <= piVar25) break;
        local_a0 = (int *)((long)piVar25 + 1);
        iVar8 = iVar24 + 1;
        if (uVar22 == 0) {
          uVar22 = 0;
        }
        else {
          UVar3 = (ms_00->window).lowLimit;
          UVar14 = iVar8 - maxDistance;
          if (iVar8 - UVar3 <= maxDistance) {
            UVar14 = UVar3;
          }
          if (ms_00->loadedDictEnd != 0) {
            UVar14 = UVar3;
          }
          uVar16 = iVar8 - local_d4;
          pBVar20 = local_b0;
          if (uVar16 < (uint)local_b8) {
            pBVar20 = local_98;
          }
          if (((2 < local_cc - uVar16) && (local_d4 <= iVar8 - UVar14)) &&
             (*local_a0 == *(int *)(pBVar20 + uVar16))) {
            piVar19 = iEnd;
            if (uVar16 < (uint)local_b8) {
              piVar19 = local_68;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar25 + 5),(BYTE *)((long)(pBVar20 + uVar16) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar19,local_78);
            if (sVar10 < 0xfffffffffffffffc) {
              uVar16 = 0x1f;
              if ((uint)uVar22 != 0) {
                for (; (uint)uVar22 >> uVar16 == 0; uVar16 = uVar16 - 1) {
                }
              }
              if ((int)((uVar16 ^ 0x1f) + (int)uVar11 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                local_c8 = local_a0;
                uVar22 = 1;
                uVar11 = sVar10 + 4;
              }
            }
          }
        }
        ofbCandidate = 999999999;
        if (local_bc == 6) {
          if (local_d8 == 6) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_6
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_d8 == 5) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_5
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_4
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (local_bc == 5) {
          if (local_d8 == 6) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_6
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_d8 == 5) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_5
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_4
                               (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (local_d8 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_6
                             (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_d8 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_5
                             (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_4
                             (ms_00,(BYTE *)local_a0,(BYTE *)iEnd,&ofbCandidate);
        }
        uVar16 = (uint)uVar22;
        if (3 < uVar12) {
          uVar9 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          iVar6 = 0x1f;
          if ((uint)ofbCandidate != 0) {
            for (; (uint)ofbCandidate >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar11 * 4 + -0x1b) < (int)uVar12 * 4 - iVar6) {
            local_c8 = local_a0;
            sVar10 = ofbCandidate;
            piVar25 = local_a0;
            iVar24 = iVar8;
            piVar19 = local_c8;
            goto LAB_001592b1;
          }
        }
        pBVar20 = local_98;
        if (local_70 <= local_a0) break;
        piVar19 = (int *)((long)piVar25 + 2);
        iVar24 = iVar24 + 2;
        if (uVar22 == 0) {
          uVar22 = 0;
        }
        else {
          UVar3 = (ms_00->window).lowLimit;
          UVar14 = iVar24 - maxDistance;
          if (iVar24 - UVar3 <= maxDistance) {
            UVar14 = UVar3;
          }
          if (ms_00->loadedDictEnd != 0) {
            UVar14 = UVar3;
          }
          uVar9 = iVar24 - local_d4;
          pBVar20 = local_b0;
          if (uVar9 < (uint)local_b8) {
            pBVar20 = local_98;
          }
          if (((2 < local_cc - uVar9) && (local_d4 <= iVar24 - UVar14)) &&
             (*piVar19 == *(int *)(pBVar20 + uVar9))) {
            mEnd = iEnd;
            if (uVar9 < (uint)local_b8) {
              mEnd = local_68;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar25 + 6),(BYTE *)((long)(pBVar20 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_78);
            if (sVar10 < 0xfffffffffffffffc) {
              uVar9 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              if ((int)((uVar9 ^ 0x1f) + (int)uVar11 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
                uVar22 = 1;
                uVar11 = sVar10 + 4;
                local_c8 = piVar19;
              }
            }
          }
        }
        pBVar20 = local_98;
        ofbCandidate = 999999999;
        if (local_bc == 6) {
          if (local_d8 == 6) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_6
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_d8 == 5) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_5
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar12 = ZSTD_RowFindBestMatch_extDict_6_4
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (local_bc == 5) {
          if (local_d8 == 6) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_6
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_d8 == 5) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_5
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar12 = ZSTD_RowFindBestMatch_extDict_5_4
                               (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (local_d8 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_6
                             (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_d8 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_5
                             (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_extDict_4_4
                             (ms_00,(BYTE *)piVar19,(BYTE *)iEnd,&ofbCandidate);
        }
        if (uVar12 < 4) break;
        uVar16 = 0x1f;
        if ((uint)uVar22 != 0) {
          for (; (uint)uVar22 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        iVar8 = 0x1f;
        if ((uint)ofbCandidate != 0) {
          for (; (uint)ofbCandidate >> iVar8 == 0; iVar8 = iVar8 + -1) {
          }
        }
        sVar10 = ofbCandidate;
        piVar25 = piVar19;
      } while ((int)((uVar16 ^ 0x1f) + (int)uVar11 * 4 + -0x18) < (int)uVar12 * 4 - iVar8);
      psVar23 = local_50;
      piVar25 = local_c8;
      if (3 < uVar22) {
        pBVar17 = (BYTE *)((long)local_c8 + (-(long)local_b0 - uVar22) + 3);
        pBVar21 = local_78;
        pBVar13 = local_b0;
        if ((uint)pBVar17 < (uint)local_b8) {
          pBVar21 = local_40;
          pBVar13 = pBVar20;
        }
        pBVar13 = pBVar13 + ((ulong)pBVar17 & 0xffffffff);
        for (; ((local_88 < piVar25 && (pBVar21 < pBVar13)) &&
               (*(BYTE *)((long)piVar25 + -1) == pBVar13[-1]));
            piVar25 = (int *)((long)piVar25 + -1)) {
          pBVar13 = pBVar13 + -1;
          uVar11 = uVar11 + 1;
        }
        local_d0 = local_d4;
        local_d4 = (U32)uVar22 - 3;
      }
      if (local_50->maxNbSeq <=
          (ulong)((long)local_50->sequences - (long)local_50->sequencesStart >> 3)) {
LAB_00159c75:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_50->maxNbLit) {
LAB_00159c94:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar12 = (long)piVar25 - (long)local_88;
      pBVar20 = local_50->lit;
      if (local_50->litStart + local_50->maxNbLit < pBVar20 + uVar12) {
LAB_00159c37:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < piVar25) {
LAB_00159c56:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_58 < piVar25) {
        ZSTD_safecopyLiterals(pBVar20,(BYTE *)local_88,(BYTE *)piVar25,(BYTE *)local_58);
LAB_001597ca:
        psVar23->lit = psVar23->lit + uVar12;
        if (0xffff < uVar12) {
          if (psVar23->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar23->longLengthType = ZSTD_llt_literalLength;
          psVar23->longLengthPos =
               (U32)((ulong)((long)psVar23->sequences - (long)psVar23->sequencesStart) >> 3);
        }
      }
      else {
        uVar7 = *(undefined8 *)(local_88 + 2);
        *(undefined8 *)pBVar20 = *(undefined8 *)local_88;
        *(undefined8 *)(pBVar20 + 8) = uVar7;
        pBVar20 = local_50->lit;
        if (0x10 < uVar12) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar20 + 0x10 + (-0x10 - (long)(local_88 + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar7 = *(undefined8 *)(local_88 + 6);
          *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(local_88 + 4);
          *(undefined8 *)(pBVar20 + 0x18) = uVar7;
          if (0x20 < (long)uVar12) {
            lVar18 = 0;
            do {
              puVar2 = (undefined8 *)((long)local_88 + lVar18 + 0x20);
              uVar7 = puVar2[1];
              pBVar13 = pBVar20 + lVar18 + 0x20;
              *(undefined8 *)pBVar13 = *puVar2;
              *(undefined8 *)(pBVar13 + 8) = uVar7;
              puVar2 = (undefined8 *)((long)local_88 + lVar18 + 0x30);
              uVar7 = puVar2[1];
              *(undefined8 *)(pBVar13 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar13 + 0x18) = uVar7;
              lVar18 = lVar18 + 0x20;
            } while (pBVar13 + 0x20 < pBVar20 + uVar12);
          }
          goto LAB_001597ca;
        }
        local_50->lit = pBVar20 + uVar12;
      }
      psVar5 = psVar23->sequences;
      psVar5->litLength = (U16)uVar12;
      psVar5->offBase = (U32)uVar22;
      if (uVar11 < 3) {
LAB_00159cb3:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar11 - 3) {
        if (psVar23->longLengthType != ZSTD_llt_none) {
LAB_00159cd2:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar23->longLengthType = ZSTD_llt_matchLength;
        psVar23->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar23->sequencesStart) >> 3);
      }
      psVar5->mlBase = (U16)(uVar11 - 3);
      psVar23->sequences = psVar5 + 1;
      if (ms_00->lazySkipping != 0) {
        piVar19 = (int *)(ulong)ms_00->nextToUpdate;
        UVar3 = ms_00->rowHashLog;
        uVar16 = ((int)local_70 - (int)(local_b0 + (long)piVar19)) + 1;
        if (7 < uVar16) {
          uVar16 = 8;
        }
        if (local_70 < local_b0 + (long)piVar19) {
          uVar16 = 0;
        }
        pUVar4 = ms_00->hashTable;
        pBVar20 = ms_00->tagTable;
        local_88 = (int *)(ulong)(uVar16 + ms_00->nextToUpdate);
        local_a0 = (int *)(ulong)(0x38 - UVar3);
        local_5c = 0x18 - UVar3;
        local_c8 = piVar25;
        for (; piVar19 < local_88; piVar19 = (int *)((long)piVar19 + 1)) {
          if (0x20 < UVar3 + 8) goto LAB_00159bda;
          plVar1 = (long *)(local_b0 + (long)piVar19);
          uVar22 = local_80->hashSalt;
          if (local_bc == 5) {
            sVar10 = (*plVar1 * -0x30e4432345000000 ^ uVar22) >> ((byte)local_a0 & 0x3f);
          }
          else if (local_bc == 6) {
            sVar10 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar22);
          }
          else {
            sVar10 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar22) >> ((byte)local_5c & 0x1f)
                             );
          }
          uVar16 = ((uint)(sVar10 >> 8) & 0xffffff) << ((byte)local_d8 & 0x1f);
          if (((ulong)(pUVar4 + uVar16) & 0x3f) != 0) goto LAB_00159bf9;
          iVar8 = ZSTD_isAligned(pBVar20 + uVar16,local_48);
          if (iVar8 == 0) goto LAB_00159c18;
          local_80->hashCache[(uint)piVar19 & 7] = (U32)sVar10;
          psVar23 = local_50;
        }
        local_80->lazySkipping = 0;
        piVar25 = local_c8;
        ms_00 = local_80;
      }
      uVar15 = local_d4;
      uVar16 = local_d0;
      for (piVar25 = (int *)((long)piVar25 + uVar11); uVar9 = uVar15, piVar19 = piVar25,
          pBVar20 = local_98, piVar25 <= local_70; piVar25 = (int *)((long)piVar25 + sVar10 + 4)) {
        iVar8 = (int)piVar25 - (int)local_b0;
        UVar3 = (ms_00->window).lowLimit;
        UVar14 = iVar8 - maxDistance;
        if (iVar8 - UVar3 <= maxDistance) {
          UVar14 = UVar3;
        }
        if (ms_00->loadedDictEnd != 0) {
          UVar14 = UVar3;
        }
        uVar15 = iVar8 - uVar16;
        pBVar13 = local_b0;
        if (uVar15 < (uint)local_b8) {
          pBVar13 = local_98;
        }
        if (((local_cc - uVar15 < 3) || (iVar8 - UVar14 < uVar16)) ||
           (*piVar25 != *(int *)(pBVar13 + uVar15))) break;
        piVar19 = iEnd;
        if (uVar15 < (uint)local_b8) {
          piVar19 = local_68;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)(piVar25 + 1),(BYTE *)((long)(pBVar13 + uVar15) + 4),
                            (BYTE *)iEnd,(BYTE *)piVar19,local_78);
        if (psVar23->maxNbSeq <=
            (ulong)((long)psVar23->sequences - (long)psVar23->sequencesStart >> 3))
        goto LAB_00159c75;
        if (0x20000 < psVar23->maxNbLit) goto LAB_00159c94;
        pBVar20 = psVar23->lit;
        if (psVar23->litStart + psVar23->maxNbLit < pBVar20) goto LAB_00159c37;
        if (iEnd < piVar25) goto LAB_00159c56;
        if (local_58 < piVar25) {
          ZSTD_safecopyLiterals(pBVar20,(BYTE *)piVar25,(BYTE *)piVar25,(BYTE *)local_58);
        }
        else {
          uVar7 = *(undefined8 *)(piVar25 + 2);
          *(undefined8 *)pBVar20 = *(undefined8 *)piVar25;
          *(undefined8 *)(pBVar20 + 8) = uVar7;
        }
        psVar5 = psVar23->sequences;
        psVar5->litLength = 0;
        psVar5->offBase = 1;
        if (sVar10 + 4 < 3) goto LAB_00159cb3;
        if (0xffff < sVar10 + 1) {
          if (psVar23->longLengthType != ZSTD_llt_none) goto LAB_00159cd2;
          psVar23->longLengthType = ZSTD_llt_matchLength;
          psVar23->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar23->sequencesStart) >> 3)
          ;
        }
        psVar5->mlBase = (U16)(sVar10 + 1);
        psVar23->sequences = psVar5 + 1;
        uVar15 = uVar16;
        uVar16 = uVar9;
      }
      goto LAB_001590bf;
    }
    uVar22 = (long)piVar25 - (long)local_88;
    piVar25 = (int *)((long)piVar25 + (uVar22 >> 8) + 1);
    ms_00->lazySkipping = (uint)(0x8ff < uVar22);
    uVar9 = local_d4;
    uVar16 = local_d0;
    piVar19 = local_88;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}